

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::json_abi_v3_11_3::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
::basic_json(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *other)

{
  json_value local_68;
  json_value local_60;
  json_value local_58;
  json_value local_50;
  json_value local_48;
  json_value local_40;
  json_value local_38 [3];
  json_value local_20;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *local_18;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *other_local;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *this_local;
  
  *(undefined8 *)&this->m_data = 0;
  (this->m_data).m_value.object = (object_t *)0x0;
  local_18 = other;
  other_local = this;
  data::data(&this->m_data);
  (this->m_data).m_type = (local_18->m_data).m_type;
  assert_invariant(local_18,true);
  switch((this->m_data).m_type) {
  case null:
  case discarded:
    break;
  case object:
    json_value::json_value((json_value *)&local_20.boolean,(local_18->m_data).m_value.object);
    (this->m_data).m_value = local_20;
    break;
  case array:
    json_value::json_value((json_value *)&local_38[0].boolean,(local_18->m_data).m_value.array);
    (this->m_data).m_value = local_38[0];
    break;
  case string:
    json_value::json_value((json_value *)&local_40.boolean,(local_18->m_data).m_value.string);
    (this->m_data).m_value = local_40;
    break;
  case boolean:
    json_value::json_value
              ((json_value *)&local_48.boolean,(boolean_t)((local_18->m_data).m_value.boolean & 1));
    (this->m_data).m_value = local_48;
    break;
  case number_integer:
    json_value::json_value
              ((json_value *)&local_50.boolean,(local_18->m_data).m_value.number_integer);
    (this->m_data).m_value = local_50;
    break;
  case number_unsigned:
    json_value::json_value
              ((json_value *)&local_58.boolean,(local_18->m_data).m_value.number_unsigned);
    (this->m_data).m_value = local_58;
    break;
  case number_float:
    json_value::json_value((json_value *)&local_60.boolean,(local_18->m_data).m_value.number_float);
    (this->m_data).m_value = local_60;
    break;
  case binary:
    json_value::json_value((json_value *)&local_68.boolean,(local_18->m_data).m_value.binary);
    (this->m_data).m_value = local_68;
  }
  set_parents(this);
  assert_invariant(this,true);
  return;
}

Assistant:

basic_json(const basic_json& other)
        : json_base_class_t(other)
    {
        m_data.m_type = other.m_data.m_type;
        // check of passed value is valid
        other.assert_invariant();

        switch (m_data.m_type)
        {
            case value_t::object:
            {
                m_data.m_value = *other.m_data.m_value.object;
                break;
            }

            case value_t::array:
            {
                m_data.m_value = *other.m_data.m_value.array;
                break;
            }

            case value_t::string:
            {
                m_data.m_value = *other.m_data.m_value.string;
                break;
            }

            case value_t::boolean:
            {
                m_data.m_value = other.m_data.m_value.boolean;
                break;
            }

            case value_t::number_integer:
            {
                m_data.m_value = other.m_data.m_value.number_integer;
                break;
            }

            case value_t::number_unsigned:
            {
                m_data.m_value = other.m_data.m_value.number_unsigned;
                break;
            }

            case value_t::number_float:
            {
                m_data.m_value = other.m_data.m_value.number_float;
                break;
            }

            case value_t::binary:
            {
                m_data.m_value = *other.m_data.m_value.binary;
                break;
            }

            case value_t::null:
            case value_t::discarded:
            default:
                break;
        }

        set_parents();
        assert_invariant();
    }